

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinterface.cpp
# Opt level: O2

int __thiscall UInterface::init(UInterface *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  string local_38;
  
  this->n = (int)ctx;
  GameLogic::startGame(&this->logic,(int)ctx);
  GameLogic::getCommands_abi_cxx11_(&local_38,&this->logic);
  std::__cxx11::string::operator=((string *)&this->jsoncmd,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::append((string *)&this->full_json);
  local_38._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->ids,(long)this->n,(value_type_conflict1 *)&local_38);
  local_38._M_dataplus._M_p = (pointer)0x0;
  std::vector<DllInterface_*,_std::allocator<DllInterface_*>_>::_M_fill_assign
            (&this->dlls,(long)this->n,(value_type *)&local_38);
  return extraout_EAX;
}

Assistant:

void UInterface::init(int playerCount)
{
    n = playerCount;
    logic.startGame(n);
    jsoncmd = logic.getCommands();
    full_json += jsoncmd;

    ids.assign(n, -1);
    dlls.assign(n, nullptr);
}